

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerialQueue.cpp
# Opt level: O2

void __thiscall
SerialExecutionQueue::addJob(SerialExecutionQueue *this,QueueJob *job,QueueJobPriority param_2)

{
  work_fn_ty *pwVar1;
  SerialQueueImpl *this_00;
  anon_class_48_2_16dd914e local_60;
  _Any_data local_30;
  code *local_20;
  
  this_00 = this->queue;
  local_60.jobID = this->jobCount + 1;
  this->jobCount = local_60.jobID;
  llbuild::basic::QueueJob::QueueJob(&local_60.job,job);
  std::function<void()>::
  function<SerialExecutionQueue::addJob(llbuild::basic::QueueJob,llbuild::basic::QueueJobPriority)::_lambda()_1_,void>
            ((function<void()> *)local_30._M_pod_data,&local_60);
  anon_unknown.dwarf_1c19eb::SerialQueueImpl::async(this_00,(function<void_()> *)&local_30);
  if (local_20 != (code *)0x0) {
    (*local_20)(&local_30,&local_30,__destroy_functor);
  }
  if (local_60.job.work.super__Function_base._M_manager != (_Manager_type)0x0) {
    pwVar1 = &local_60.job.work;
    (*local_60.job.work.super__Function_base._M_manager)
              ((_Any_data *)pwVar1,(_Any_data *)pwVar1,__destroy_functor);
  }
  return;
}

Assistant:

virtual void addJob(QueueJob job, QueueJobPriority) override {
    uint64_t jobID = ++jobCount;
    queue->async([jobID, job]() mutable {
      SerialContext ctx(jobID, job);
      job.execute(&ctx);
    });
  }